

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O2

void __thiscall TasGrid::GridSequence::loadConstructedPoints(GridSequence *this)

{
  MultiIndexSet *current;
  _Fwd_list_impl _Var1;
  vector<double,_std::allocator<double>_> vals;
  MultiIndexSet new_points;
  Data2D<int> candidates;
  MultiIndexSet local_90;
  MultiIndexSet local_68;
  Data2D<int> local_40;
  
  Data2D<int>::Data2D<int,int>(&local_40,(this->super_BaseCanonicalGrid).num_dimensions,0);
  _Var1._M_head._M_next =
       (_Fwd_list_node_base)
       &((this->dynamic_values)._M_t.
         super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
         ._M_t.
         super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
         .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl)->data;
  while (_Var1._M_head._M_next = *(_Fwd_list_node_base *)_Var1._M_head._M_next,
        (_Fwd_list_impl)_Var1._M_head._M_next != (_Fwd_list_impl)0x0) {
    Data2D<int>::appendStrip
              (&local_40,(vector<int,_std::allocator<int>_> *)((long)_Var1._M_head._M_next + 8));
  }
  MultiIndexSet::MultiIndexSet(&local_90,&local_40);
  current = &(this->super_BaseCanonicalGrid).points;
  MultiIndexManipulations::getLargestCompletion(&local_68,current,&local_90);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_90.indexes.super__Vector_base<int,_std::allocator<int>_>);
  if (local_68.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start !=
      local_68.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    clearGpuNodes(this);
    clearGpuSurpluses(this);
    SimpleConstructData::extractValues
              ((vector<double,_std::allocator<double>_> *)&local_90,
               (this->dynamic_values)._M_t.
               super___uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::SimpleConstructData_*,_std::default_delete<TasGrid::SimpleConstructData>_>
               .super__Head_base<0UL,_TasGrid::SimpleConstructData_*,_false>._M_head_impl,&local_68)
    ;
    if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      MultiIndexSet::operator=(current,&local_68);
      StorageSet::setValues
                (&(this->super_BaseCanonicalGrid).values,
                 (vector<double,_std::allocator<double>_> *)&local_90);
    }
    else {
      StorageSet::addValues
                (&(this->super_BaseCanonicalGrid).values,current,&local_68,
                 (double *)local_90.num_dimensions);
      MultiIndexSet::operator+=(current,&local_68);
    }
    prepareSequence(this,0);
    recomputeSurpluses(this);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_90);
  }
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_68.indexes.super__Vector_base<int,_std::allocator<int>_>);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_40.vec.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void GridSequence::loadConstructedPoints(){
    Data2D<int> candidates(num_dimensions, 0);
    for(auto &d : dynamic_values->data)
        candidates.appendStrip(d.point);
    auto new_points = MultiIndexManipulations::getLargestCompletion(points, MultiIndexSet(candidates));
    if (new_points.empty()) return;

    clearGpuNodes(); // the points will change, clear the cache
    clearGpuSurpluses();

    auto vals = dynamic_values->extractValues(new_points);
    if (points.empty()){
        points = std::move(new_points);
        values.setValues(std::move(vals));
    }else{
        values.addValues(points, new_points, vals.data());
        points += new_points;
    }
    prepareSequence(0); // update the directional max_levels, will not shrink the number of nodes
    recomputeSurpluses(); // costly, but the only option under the circumstances
}